

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# full_gal_tests.cc
# Opt level: O3

void __thiscall
lf::uscalfe::test::lf_full_bd_a_2_Test::~lf_full_bd_a_2_Test(lf_full_bd_a_2_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(lf_full, bd_a_2) {
  // Four levels of refinement
  const int reflevels = REFLEV;
  std::cout << "<<<< TEST: Boundary energy test 2, linear f >>>>" << std::endl;

  std::cout << "eta = x^2+y^2 => energy = 46/3" << std::endl;
  // Synthetic function
  auto v = mesh::utils::MeshFunctionGlobal(
      [](Eigen::Vector2d x) -> double { return (2.0 * x[0] + x[1]); });
  // Impedance coefficient
  auto eta = mesh::utils::MeshFunctionGlobal(
      [](Eigen::Vector2d x) -> double { return (x[0] * x[0] + x[1] * x[1]); });

  auto en{LinFEInterfaceEnergyTest(reflevels, v, eta)};
  EXPECT_NEAR(en.back(), 46.0 / 3.0, 1.0E-4);
}